

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

bool __thiscall
argstest::ArgumentParser::
ParseShort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
          (ArgumentParser *this,
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *it,__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              end)

{
  bool bVar1;
  char cVar2;
  bool bVar3;
  byte bVar4;
  byte bVar5;
  int iVar6;
  reference pbVar7;
  reference pcVar8;
  undefined4 extraout_var;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __beg;
  const_iterator __end;
  ulong uVar10;
  allocator local_1c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  undefined1 local_180 [8];
  string errorMessage_1;
  allocator local_149;
  string local_148;
  undefined1 local_128 [8];
  string errorMessage;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  values;
  undefined1 local_d8 [8];
  string value;
  EitherFlag local_a8;
  FlagBase *local_80;
  FlagBase *flag;
  const_iterator cStack_70;
  char arg;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  const_iterator argit;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> argchunk;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *chunk;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *it_local;
  ArgumentParser *this_local;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  end_local;
  FlagBase *pFVar9;
  
  pbVar7 = __gnu_cxx::
           __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(it);
  std::__cxx11::string::size();
  std::__cxx11::string::substr((ulong)&argit,(ulong)pbVar7);
  local_68._M_current =
       (char *)std::begin<std::__cxx11::string>
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &argit);
  do {
    cStack_70 = std::end<std::__cxx11::string>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &argit);
    bVar3 = __gnu_cxx::operator!=(&local_68,&stack0xffffffffffffff90);
    if (!bVar3) {
LAB_0026079f:
      end_local._M_current._7_1_ = 1;
      errorMessage_1.field_2._12_4_ = 1;
LAB_002607ad:
      std::__cxx11::string::~string((string *)&argit);
      return (bool)(end_local._M_current._7_1_ & 1);
    }
    pcVar8 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_68);
    flag._7_1_ = *pcVar8;
    EitherFlag::EitherFlag(&local_a8,flag._7_1_);
    iVar6 = (*(this->super_Command).super_Group.super_Base._vptr_Base[7])(this,&local_a8);
    pFVar9 = (FlagBase *)CONCAT44(extraout_var,iVar6);
    EitherFlag::~EitherFlag(&local_a8);
    cVar2 = flag._7_1_;
    local_80 = pFVar9;
    if (pFVar9 == (FlagBase *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1c0,1,cVar2,&local_1c1);
      std::operator+(&local_1a0,"Flag could not be matched: \'",&local_1c0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180,
                     &local_1a0,"\'");
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
      (this->super_Command).super_Group.super_Base.error = Parse;
      std::__cxx11::string::operator=
                ((string *)&(this->super_Command).super_Group.super_Base.errorMsg,
                 (string *)local_180);
      end_local._M_current._7_1_ = 0;
      errorMessage_1.field_2._12_4_ = 1;
      std::__cxx11::string::~string((string *)local_180);
      goto LAB_002607ad;
    }
    __beg = __gnu_cxx::
            __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator+(&local_68,1);
    __end = std::end<std::__cxx11::string>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&argit);
    std::allocator<char>::allocator();
    std::__cxx11::string::
    string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
              ((string *)local_d8,__beg,
               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )__end._M_current,
               (allocator<char> *)
               ((long)&values.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&values.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&errorMessage.field_2 + 8));
    cVar2 = flag._7_1_;
    pFVar9 = local_80;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_148,1,cVar2,&local_149);
    bVar3 = this->allowSeparateShortValue;
    bVar1 = this->allowJoinedShortValue;
    bVar4 = std::__cxx11::string::empty();
    bVar5 = std::__cxx11::string::empty();
    ParseArgsValues<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((string *)local_128,this,pFVar9,&local_148,it,end,(bool)(bVar3 & 1),(bool)(bVar1 & 1)
               ,(bool)(bVar4 ^ 1),(string *)local_d8,(bool)(bVar5 ^ 1),
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&errorMessage.field_2 + 8));
    std::__cxx11::string::~string((string *)&local_148);
    std::allocator<char>::~allocator((allocator<char> *)&local_149);
    uVar10 = std::__cxx11::string::empty();
    if ((uVar10 & 1) == 0) {
      (this->super_Command).super_Group.super_Base.error = Parse;
      std::__cxx11::string::operator=
                ((string *)&(this->super_Command).super_Group.super_Base.errorMsg,
                 (string *)local_128);
      end_local._M_current._7_1_ = 0;
      errorMessage_1.field_2._12_4_ = 1;
    }
    else {
      if ((this->readCompletion & 1U) == 0) {
        (*(local_80->super_NamedBase).super_Base._vptr_Base[0x16])
                  (local_80,(undefined1 *)((long)&errorMessage.field_2 + 8));
      }
      bVar3 = Base::KickOut((Base *)local_80);
      if (bVar3) {
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(it);
        end_local._M_current._7_1_ = 0;
        errorMessage_1.field_2._12_4_ = 1;
      }
      else {
        bVar3 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)((long)&errorMessage.field_2 + 8));
        if (bVar3) {
          errorMessage_1.field_2._12_4_ = 0;
        }
        else {
          errorMessage_1.field_2._12_4_ = 2;
        }
      }
    }
    std::__cxx11::string::~string((string *)local_128);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&errorMessage.field_2 + 8));
    std::__cxx11::string::~string((string *)local_d8);
    if (errorMessage_1.field_2._12_4_ != 0) {
      if (errorMessage_1.field_2._12_4_ != 2) goto LAB_002607ad;
      goto LAB_0026079f;
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_68);
  } while( true );
}

Assistant:

bool ParseShort(It &it, It end)
            {
                const auto &chunk = *it;
                const auto argchunk = chunk.substr(shortprefix.size());
                for (auto argit = std::begin(argchunk); argit != std::end(argchunk); ++argit)
                {
                    const auto arg = *argit;

                    if (auto flag = Match(arg))
                    {
                        const std::string value(argit + 1, std::end(argchunk));
                        std::vector<std::string> values;
                        const std::string errorMessage = ParseArgsValues(*flag, std::string(1, arg), it, end,
                                                                         allowSeparateShortValue, allowJoinedShortValue,
                                                                         !value.empty(), value, !value.empty(), values);

                        if (!errorMessage.empty())
                        {
#ifndef ARGS_NOEXCEPT
                            throw ParseError(errorMessage);
#else
                            error = Error::Parse;
                            errorMsg = errorMessage;
                            return false;
#endif
                        }

                        if (!readCompletion)
                        {
                            flag->ParseValue(values);
                        }

                        if (flag->KickOut())
                        {
                            ++it;
                            return false;
                        }

                        if (!values.empty())
                        {
                            break;
                        }
                    } else
                    {
                        const std::string errorMessage("Flag could not be matched: '" + std::string(1, arg) + "'");
#ifndef ARGS_NOEXCEPT
                        throw ParseError(errorMessage);
#else
                        error = Error::Parse;
                        errorMsg = errorMessage;
                        return false;
#endif
                    }
                }

                return true;
            }